

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O3

void __thiscall
cbtIDebugDraw::drawSpherePatch
          (cbtIDebugDraw *this,cbtVector3 *center,cbtVector3 *up,cbtVector3 *axis,cbtScalar radius,
          cbtScalar minTh,cbtScalar maxTh,cbtScalar minPs,cbtScalar maxPs,cbtVector3 *color,
          cbtScalar stepDegrees,bool drawCenter)

{
  cbtScalar *pcVar1;
  float fVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  bool bVar8;
  undefined1 *puVar9;
  long lVar10;
  undefined1 *puVar11;
  cbtVector3 *pcVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  undefined1 *puVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 in_register_00001244 [60];
  undefined1 auVar31 [16];
  undefined1 in_register_00001344 [60];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 in_XMM17 [16];
  cbtVector3 arcStart;
  cbtVector3 vB [74];
  cbtVector3 vA [74];
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  float local_a18;
  cbtVector3 local_9a8;
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [1184];
  undefined1 local_4d8 [1192];
  
  auVar32._4_60_ = in_register_00001344;
  auVar32._0_4_ = stepDegrees;
  fVar2 = up->m_floats[0];
  auVar20 = vmulss_avx512f(auVar32._0_16_,ZEXT416(0x3c8efa35));
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(up->m_floats + 1);
  fVar27 = (float)*(ulong *)(up->m_floats + 1);
  fVar18 = fVar27 * radius;
  auVar23 = vmovshdup_avx(auVar31);
  fVar19 = auVar23._0_4_ * radius;
  auVar22 = vinsertps_avx(ZEXT416((uint)(fVar2 * radius + center->m_floats[0])),
                          ZEXT416((uint)(fVar18 + center->m_floats[1])),0x10);
  auVar21 = vinsertps_avx(ZEXT416((uint)(center->m_floats[0] - fVar2 * radius)),
                          ZEXT416((uint)(center->m_floats[1] - fVar18)),0x10);
  local_988 = vinsertps_avx(auVar22,ZEXT416((uint)(fVar19 + center->m_floats[2])),0x28);
  local_998 = vinsertps_avx(auVar21,ZEXT416((uint)(center->m_floats[2] - fVar19)),0x28);
  auVar22 = vinsertps_avx(auVar23,ZEXT416((uint)fVar2),0x10);
  uVar3 = *(ulong *)(axis->m_floats + 1);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar3;
  bVar4 = minTh <= -1.5707964;
  auVar21 = vaddss_avx512f(auVar20,SUB6416(ZEXT464(0xbfc90fdb),0));
  auVar33._0_4_ = (float)uVar3 * auVar22._0_4_;
  auVar33._4_4_ = (float)(uVar3 >> 0x20) * auVar22._4_4_;
  auVar33._8_4_ = auVar22._8_4_ * 0.0;
  auVar33._12_4_ = auVar22._12_4_ * 0.0;
  auVar22._4_12_ = in_register_00001244._0_12_;
  auVar22._0_4_ = (float)((uint)bVar4 * auVar21._0_4_ + (uint)!bVar4 * (int)minTh);
  bVar5 = 1.5707964 <= maxTh;
  auVar23 = vsubss_avx512f(SUB6416(ZEXT464(0x3fc90fdb),0),auVar20);
  auVar24 = vpermi2ps_avx512vl(_DAT_009d86b0,auVar26,ZEXT416((uint)axis->m_floats[0]));
  fVar18 = (float)((uint)bVar5 * (int)auVar23._0_4_ + (uint)!bVar5 * (int)maxTh);
  bVar6 = fVar18 < auVar22._0_4_;
  if (bVar6) {
    auVar22 = auVar21;
    fVar18 = auVar23._0_4_;
  }
  fVar18 = fVar18 - auVar22._0_4_;
  auVar25 = vdivss_avx512f(ZEXT416((uint)fVar18),auVar20);
  auVar21 = vfmsub213ps_fma(auVar24,auVar31,auVar33);
  auVar23 = vfmsub213ss_fma(auVar26,ZEXT416((uint)fVar2),ZEXT416((uint)(axis->m_floats[0] * fVar27))
                           );
  uVar7 = (int)auVar25._0_4_;
  if ((int)auVar25._0_4_ < 2) {
    uVar7 = 1;
  }
  auVar24 = vcvtsi2ss_avx512f(in_XMM17,uVar7);
  bVar8 = maxPs < minPs;
  auVar26 = vaddss_avx512f(auVar20,ZEXT416(0xc0490fdb));
  fVar19 = (float)((uint)bVar8 * auVar26._0_4_ + (uint)!bVar8 * (int)minPs);
  fVar2 = (float)((uint)bVar8 * 0x40490fdb + (uint)!bVar8 * (int)maxPs) - fVar19;
  auVar20 = vdivss_avx512f(ZEXT416((uint)fVar2),auVar20);
  uVar14 = 1;
  if (1 < (int)auVar20._0_4_) {
    uVar14 = (int)auVar20._0_4_;
  }
  auVar20 = vcvtsi2ss_avx512f(in_XMM17,uVar14);
  lVar10 = (ulong)uVar14 * 0x10;
  puVar11 = local_4d8;
  puVar16 = local_978;
  uVar14 = 0;
  do {
    puVar9 = puVar11;
    auVar26 = vcvtsi2ss_avx512f(in_XMM17,uVar14);
    auVar26 = vfmadd132ss_fma(auVar26,auVar22,ZEXT416((uint)(fVar18 / auVar24._0_4_)));
    fVar27 = sinf(auVar26._0_4_);
    fVar27 = fVar27 * radius;
    fVar28 = cosf(auVar26._0_4_);
    iVar13 = 0;
    lVar15 = 0;
    do {
      auVar26 = vcvtsi2ss_avx512f(in_XMM17,iVar13);
      auVar26 = vfmadd213ss_fma(auVar26,ZEXT416((uint)(fVar2 / auVar20._0_4_)),ZEXT416((uint)fVar19)
                               );
      fVar29 = sinf(auVar26._0_4_);
      fVar30 = cosf(auVar26._0_4_);
      pcVar1 = (cbtScalar *)(puVar16 + lVar15);
      fVar30 = fVar28 * radius * fVar30;
      fVar29 = fVar28 * radius * fVar29;
      local_a18 = auVar23._0_4_;
      local_a28 = auVar21._0_4_;
      fStack_a24 = auVar21._4_4_;
      fStack_a20 = auVar21._8_4_;
      fStack_a1c = auVar21._12_4_;
      auVar25._0_4_ =
           fVar29 * local_a28 +
           (float)*(undefined8 *)axis->m_floats * fVar30 + (float)*(undefined8 *)center->m_floats +
           (float)*(undefined8 *)up->m_floats * fVar27;
      auVar25._4_4_ =
           fVar29 * fStack_a24 +
           (float)((ulong)*(undefined8 *)axis->m_floats >> 0x20) * fVar30 +
           (float)((ulong)*(undefined8 *)center->m_floats >> 0x20) +
           (float)((ulong)*(undefined8 *)up->m_floats >> 0x20) * fVar27;
      auVar25._8_4_ = fVar29 * fStack_a20 + fVar30 * 0.0 + 0.0 + fVar27 * 0.0;
      auVar25._12_4_ = fVar29 * fStack_a1c + fVar30 * 0.0 + 0.0 + fVar27 * 0.0;
      auVar26 = vinsertps_avx(auVar25,ZEXT416((uint)(fVar29 * local_a18 +
                                                     fVar30 * axis->m_floats[2] +
                                                     center->m_floats[2] + fVar27 * up->m_floats[2])
                                             ),0x28);
      *(undefined1 (*) [16])(puVar16 + lVar15) = auVar26;
      if (uVar14 == 0) {
        puVar11 = local_998;
        if (bVar6 || bVar5) goto LAB_007f2b37;
      }
      else {
        puVar11 = puVar9 + lVar15;
LAB_007f2b37:
        (*this->_vptr_cbtIDebugDraw[4])(this,puVar11,pcVar1,color);
      }
      if (lVar15 == 0) {
        local_9a8.m_floats._0_8_ = *(undefined8 *)pcVar1;
        local_9a8.m_floats._8_8_ = *(undefined8 *)(pcVar1 + 2);
      }
      else {
        (*this->_vptr_cbtIDebugDraw[4])(this,puVar16 + lVar15 + -0x10,pcVar1,color);
      }
      if ((bVar6 || bVar4) && uVar14 == uVar7) {
        (*this->_vptr_cbtIDebugDraw[4])(this,local_988,pcVar1,color);
      }
      if (drawCenter) {
        if (maxPs - minPs < 6.2831855 && !bVar8) {
          pcVar12 = center;
          if ((lVar15 == 0 || lVar10 == lVar15) && (uVar14 == 0 || uVar14 == uVar7))
          goto LAB_007f2bd0;
        }
        else {
          pcVar12 = &local_9a8;
          if (lVar10 == lVar15) {
LAB_007f2bd0:
            (*this->_vptr_cbtIDebugDraw[4])(this,pcVar12,pcVar1,color);
          }
        }
      }
      lVar15 = lVar15 + 0x10;
      iVar13 = iVar13 + 1;
    } while (lVar10 + 0x10 != lVar15);
    bVar17 = uVar14 == uVar7;
    puVar11 = puVar16;
    puVar16 = puVar9;
    uVar14 = uVar14 + 1;
    if (bVar17) {
      return;
    }
  } while( true );
}

Assistant:

virtual void drawSpherePatch(const cbtVector3& center, const cbtVector3& up, const cbtVector3& axis, cbtScalar radius,
								 cbtScalar minTh, cbtScalar maxTh, cbtScalar minPs, cbtScalar maxPs, const cbtVector3& color, cbtScalar stepDegrees = cbtScalar(10.f), bool drawCenter = true)
	{
		cbtVector3 vA[74];
		cbtVector3 vB[74];
		cbtVector3 *pvA = vA, *pvB = vB, *pT;
		cbtVector3 npole = center + up * radius;
		cbtVector3 spole = center - up * radius;
		cbtVector3 arcStart;
		cbtScalar step = stepDegrees * SIMD_RADS_PER_DEG;
		const cbtVector3& kv = up;
		const cbtVector3& iv = axis;
		cbtVector3 jv = kv.cross(iv);
		bool drawN = false;
		bool drawS = false;
		if (minTh <= -SIMD_HALF_PI)
		{
			minTh = -SIMD_HALF_PI + step;
			drawN = true;
		}
		if (maxTh >= SIMD_HALF_PI)
		{
			maxTh = SIMD_HALF_PI - step;
			drawS = true;
		}
		if (minTh > maxTh)
		{
			minTh = -SIMD_HALF_PI + step;
			maxTh = SIMD_HALF_PI - step;
			drawN = drawS = true;
		}
		int n_hor = (int)((maxTh - minTh) / step) + 1;
		if (n_hor < 2) n_hor = 2;
		cbtScalar step_h = (maxTh - minTh) / cbtScalar(n_hor - 1);
		bool isClosed = false;
		if (minPs > maxPs)
		{
			minPs = -SIMD_PI + step;
			maxPs = SIMD_PI;
			isClosed = true;
		}
		else if ((maxPs - minPs) >= SIMD_PI * cbtScalar(2.f))
		{
			isClosed = true;
		}
		else
		{
			isClosed = false;
		}
		int n_vert = (int)((maxPs - minPs) / step) + 1;
		if (n_vert < 2) n_vert = 2;
		cbtScalar step_v = (maxPs - minPs) / cbtScalar(n_vert - 1);
		for (int i = 0; i < n_hor; i++)
		{
			cbtScalar th = minTh + cbtScalar(i) * step_h;
			cbtScalar sth = radius * cbtSin(th);
			cbtScalar cth = radius * cbtCos(th);
			for (int j = 0; j < n_vert; j++)
			{
				cbtScalar psi = minPs + cbtScalar(j) * step_v;
				cbtScalar sps = cbtSin(psi);
				cbtScalar cps = cbtCos(psi);
				pvB[j] = center + cth * cps * iv + cth * sps * jv + sth * kv;
				if (i)
				{
					drawLine(pvA[j], pvB[j], color);
				}
				else if (drawS)
				{
					drawLine(spole, pvB[j], color);
				}
				if (j)
				{
					drawLine(pvB[j - 1], pvB[j], color);
				}
				else
				{
					arcStart = pvB[j];
				}
				if ((i == (n_hor - 1)) && drawN)
				{
					drawLine(npole, pvB[j], color);
				}

				if (drawCenter)
				{
					if (isClosed)
					{
						if (j == (n_vert - 1))
						{
							drawLine(arcStart, pvB[j], color);
						}
					}
					else
					{
						if (((!i) || (i == (n_hor - 1))) && ((!j) || (j == (n_vert - 1))))
						{
							drawLine(center, pvB[j], color);
						}
					}
				}
			}
			pT = pvA;
			pvA = pvB;
			pvB = pT;
		}
	}